

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O2

char ** apprun_adjust_string_array_size(char **array)

{
  long lVar1;
  uint uVar2;
  char **ppcVar3;
  long lVar4;
  char **itr;
  
  uVar2 = 1;
  for (ppcVar3 = array; (ppcVar3 != (char **)0x0 && (*ppcVar3 != (char *)0x0));
      ppcVar3 = ppcVar3 + 1) {
    uVar2 = uVar2 + 1;
  }
  ppcVar3 = (char **)calloc((ulong)uVar2,8);
  for (lVar4 = 0;
      ((long *)((long)array + lVar4) != (long *)0x0 &&
      (lVar1 = *(long *)((long)array + lVar4), lVar1 != 0)); lVar4 = lVar4 + 8) {
    *(long *)((long)ppcVar3 + lVar4) = lVar1;
  }
  free(array);
  return ppcVar3;
}

Assistant:

char **apprun_adjust_string_array_size(char **array) {
    unsigned new_capacity = 1;
    for (char **itr = array; itr != NULL && *itr != NULL; itr++)
        new_capacity++;

    char **new = calloc(new_capacity, sizeof(char *));

    char **orginal_itr = array;
    char **new_itr = new;

    for (; orginal_itr != NULL && *orginal_itr != NULL; orginal_itr++, new_itr++)
        *new_itr = *orginal_itr;

    free(array);
    return new;
}